

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::synchronousFinishedSlot(QHttpThreadDelegate *this)

{
  bool bVar1;
  int iVar2;
  NetworkError NVar3;
  QHttpNetworkReply *in_RDI;
  long in_FS_OFFSET;
  QString msg;
  QString *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  QHttpNetworkReply *this_00;
  QObject *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QLatin1StringView in_stack_ffffffffffffff70;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_6c;
  QUrl local_68;
  undefined1 local_60 [64];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0xe) != 0) {
    this_00 = in_RDI;
    iVar2 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)0x30fc8b);
    if (399 < iVar2) {
      local_20 = 0xaaaaaaaaaaaaaaaa;
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QLatin1String::QLatin1String((QLatin1String *)this_00,(char *)in_RDI);
      QString::QString((QString *)this_00,in_stack_ffffffffffffff70);
      QHttpNetworkRequest::url((QHttpNetworkRequest *)in_RDI);
      QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                (&local_6c,PrettyDecoded);
      QUrl::toString((QUrlTwoFlags_conflict1 *)local_60);
      QHttpNetworkReply::reasonPhrase(in_RDI);
      QString::arg<QString,QString>
                ((QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x30fd81);
      QString::~QString((QString *)0x30fd8b);
      QString::~QString((QString *)0x30fd95);
      QUrl::~QUrl(&local_68);
      in_stack_ffffffffffffff44 = QHttpNetworkReply::statusCode((QHttpNetworkReply *)0x30fdb0);
      QHttpNetworkRequest::url((QHttpNetworkRequest *)in_RDI);
      NVar3 = statusCodeFromHttp(in_stack_ffffffffffffff68,(QUrl *)in_stack_ffffffffffffff60);
      *(NetworkError *)(in_RDI + 10) = NVar3;
      QUrl::~QUrl((QUrl *)&stack0xffffffffffffff70);
      QString::~QString((QString *)0x30fdf9);
    }
    bVar1 = QHttpNetworkReply::isCompressed
                      ((QHttpNetworkReply *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    in_RDI[9].field_0x2 = bVar1;
    QHttpNetworkReply::readAll(in_RDI);
    QByteArray::operator=
              ((QByteArray *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (QByteArray *)in_stack_ffffffffffffff38);
    QByteArray::~QByteArray((QByteArray *)0x30fe4b);
    QMetaObject::invokeMethod<>
              (in_stack_ffffffffffffff58,(char *)this_00,(ConnectionType)((ulong)in_RDI >> 0x20));
    QMetaObject::invokeMethod<>
              (in_stack_ffffffffffffff58,(char *)this_00,(ConnectionType)((ulong)in_RDI >> 0x20));
    *(undefined8 *)(in_RDI + 0xe) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::synchronousFinishedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousFinishedSlot() thread=" << QThread::currentThreadId() << "result=" << httpReply->statusCode();
#endif
    if (httpReply->statusCode() >= 400) {
            // it's an error reply
            QString msg = QLatin1StringView(QT_TRANSLATE_NOOP("QNetworkReply",
                                                              "Error transferring %1 - server replied: %2"));
            incomingErrorDetail = msg.arg(httpRequest.url().toString(), httpReply->reasonPhrase());
            incomingErrorCode = statusCodeFromHttp(httpReply->statusCode(), httpRequest.url());
    }

    isCompressed = httpReply->isCompressed();
    synchronousDownloadData = httpReply->readAll();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    httpReply = nullptr;
}